

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestResult
               (ostream *stream,TestResult *result)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  TestPartResult *pTVar3;
  long *plVar4;
  ostream *poVar5;
  uint line;
  size_type *psVar6;
  long lVar7;
  internal *piVar8;
  char *pcVar9;
  int i;
  string detail;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string location;
  string summary;
  string local_c0;
  string local_a0;
  uint local_7c;
  uint local_78;
  allocator<char> local_71;
  string local_70;
  string local_50;
  
  if ((int)((ulong)((long)(result->test_part_results_).
                          super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(result->test_part_results_).
                         super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x49249249 < 1) {
LAB_00130c15:
    if ((int)((ulong)((long)(result->test_properties_).
                            super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(result->test_properties_).
                           super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 6) == 0) {
      pcVar9 = " />\n";
      lVar7 = 4;
      goto LAB_00130c9b;
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream,">\n",2);
  }
  else {
    paVar1 = &local_c0.field_2;
    local_78 = 0;
    i = 0;
    local_7c = 0;
    do {
      pTVar3 = TestResult::GetTestPartResult(result,i);
      line = pTVar3->type_ - kNonFatalFailure;
      if (line < 2) {
        if (local_78 == 0 && local_7c == 0) {
          std::__ostream_insert<char,std::char_traits<char>>(stream,">\n",2);
        }
        piVar8 = (internal *)(pTVar3->file_name_)._M_string_length;
        if (piVar8 != (internal *)0x0) {
          piVar8 = (internal *)(pTVar3->file_name_)._M_dataplus._M_p;
        }
        FormatCompilerIndependentFileLocation_abi_cxx11_
                  (&local_70,piVar8,(char *)(ulong)(uint)pTVar3->line_number_,line);
        local_c0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c0,local_70._M_dataplus._M_p,
                   local_70._M_dataplus._M_p + local_70._M_string_length);
        std::__cxx11::string::append((char *)&local_c0);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_c0);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        psVar6 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          local_50.field_2._M_allocated_capacity = *psVar6;
          local_50.field_2._8_8_ = plVar4[3];
        }
        else {
          local_50.field_2._M_allocated_capacity = *psVar6;
          local_50._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_50._M_string_length = plVar4[1];
        *plVar4 = (long)psVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != paVar1) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(stream,"      <failure message=\"",0x18);
        EscapeXml(&local_c0,&local_50,true);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (stream,local_c0._M_dataplus._M_p,local_c0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" type=\"\">",10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != paVar1) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,local_70._M_dataplus._M_p,
                   local_70._M_dataplus._M_p + local_70._M_string_length);
        std::__cxx11::string::append((char *)&local_a0);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_a0);
        psVar6 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          local_c0.field_2._M_allocated_capacity = *psVar6;
          local_c0.field_2._8_8_ = plVar4[3];
          local_c0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_c0.field_2._M_allocated_capacity = *psVar6;
          local_c0._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_c0._M_string_length = plVar4[1];
        *plVar4 = (long)psVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        RemoveInvalidXmlCharacters(&local_a0,&local_c0);
        OutputXmlCDataSection(stream,local_a0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(stream,"</failure>\n",0xb);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != paVar1) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        local_78 = local_78 + 1;
      }
      else if (pTVar3->type_ == kSkip) {
        if (local_7c == 0 && local_78 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>(stream,">\n",2);
        }
        piVar8 = (internal *)(pTVar3->file_name_)._M_string_length;
        if (piVar8 != (internal *)0x0) {
          piVar8 = (internal *)(pTVar3->file_name_)._M_dataplus._M_p;
        }
        FormatCompilerIndependentFileLocation_abi_cxx11_
                  (&local_70,piVar8,(char *)(ulong)(uint)pTVar3->line_number_,line);
        local_c0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c0,local_70._M_dataplus._M_p,
                   local_70._M_dataplus._M_p + local_70._M_string_length);
        std::__cxx11::string::append((char *)&local_c0);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_c0);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        psVar6 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          local_50.field_2._M_allocated_capacity = *psVar6;
          local_50.field_2._8_8_ = plVar4[3];
        }
        else {
          local_50.field_2._M_allocated_capacity = *psVar6;
          local_50._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_50._M_string_length = plVar4[1];
        *plVar4 = (long)psVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != paVar1) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(stream,"      <skipped message=\"",0x18);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a0,local_50._M_dataplus._M_p,&local_71);
        EscapeXml(&local_c0,&local_a0,true);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (stream,local_c0._M_dataplus._M_p,local_c0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\">",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != paVar1) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,local_70._M_dataplus._M_p,
                   local_70._M_dataplus._M_p + local_70._M_string_length);
        std::__cxx11::string::append((char *)&local_a0);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_a0);
        psVar6 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          local_c0.field_2._M_allocated_capacity = *psVar6;
          local_c0.field_2._8_8_ = plVar4[3];
          local_c0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_c0.field_2._M_allocated_capacity = *psVar6;
          local_c0._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_c0._M_string_length = plVar4[1];
        *plVar4 = (long)psVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        RemoveInvalidXmlCharacters(&local_a0,&local_c0);
        OutputXmlCDataSection(stream,local_a0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(stream,"</skipped>\n",0xb);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != paVar1) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        local_7c = local_7c + 1;
      }
      i = i + 1;
      iVar2 = (int)((ulong)((long)(result->test_part_results_).
                                  super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(result->test_part_results_).
                                 super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4);
    } while (SBORROW4(i,iVar2 * -0x49249249) != i + iVar2 * 0x49249249 < 0);
    local_78 = local_78 | local_7c;
    if (local_78 == 0) goto LAB_00130c15;
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"      ","");
  OutputXmlTestProperties(stream,result,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pcVar9 = "    </testcase>\n";
  lVar7 = 0x10;
LAB_00130c9b:
  std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar9,lVar7);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestResult(::std::ostream* stream,
                                                   const TestResult& result) {
  int failures = 0;
  int skips = 0;
  for (int i = 0; i < result.total_part_count(); ++i) {
    const TestPartResult& part = result.GetTestPartResult(i);
    if (part.failed()) {
      if (++failures == 1 && skips == 0) {
        *stream << ">\n";
      }
      const std::string location =
          internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                          part.line_number());
      const std::string summary = location + "\n" + part.summary();
      *stream << "      <failure message=\"" << EscapeXmlAttribute(summary)
              << "\" type=\"\">";
      const std::string detail = location + "\n" + part.message();
      OutputXmlCDataSection(stream, RemoveInvalidXmlCharacters(detail).c_str());
      *stream << "</failure>\n";
    } else if (part.skipped()) {
      if (++skips == 1 && failures == 0) {
        *stream << ">\n";
      }
      const std::string location =
          internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                          part.line_number());
      const std::string summary = location + "\n" + part.summary();
      *stream << "      <skipped message=\""
              << EscapeXmlAttribute(summary.c_str()) << "\">";
      const std::string detail = location + "\n" + part.message();
      OutputXmlCDataSection(stream, RemoveInvalidXmlCharacters(detail).c_str());
      *stream << "</skipped>\n";
    }
  }

  if (failures == 0 && skips == 0 && result.test_property_count() == 0) {
    *stream << " />\n";
  } else {
    if (failures == 0 && skips == 0) {
      *stream << ">\n";
    }
    OutputXmlTestProperties(stream, result, /*indent=*/"      ");
    *stream << "    </testcase>\n";
  }
}